

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

void ures_setIsStackObject(UResourceBundle *resB,UBool state)

{
  UBool state_local;
  UResourceBundle *resB_local;
  
  if (state == '\0') {
    resB->fMagic1 = 0x12c9b17;
    resB->fMagic2 = 0x12bb38b;
  }
  else {
    resB->fMagic1 = 0;
    resB->fMagic2 = 0;
  }
  return;
}

Assistant:

static void ures_setIsStackObject( UResourceBundle* resB, UBool state) {
    if(state) {
        resB->fMagic1 = 0;
        resB->fMagic2 = 0;
    } else {
        resB->fMagic1 = MAGIC1;
        resB->fMagic2 = MAGIC2;
    }
}